

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O1

void __thiscall deqp::gls::BufferTestUtil::BufferCase::checkError(BufferCase *this)

{
  TestError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  code *local_30;
  GLenum local_28;
  
  local_28 = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
  if (local_28 == 0) {
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Got ","");
  local_30 = glu::getErrorName;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_70,&local_30);
  std::operator+(&local_50,&local_90,&local_70);
  tcu::TestError::TestError(this_00,&local_50);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BufferCase::checkError (void)
{
	glw::GLenum err = glGetError();
	if (err != GL_NO_ERROR)
		throw tcu::TestError(string("Got ") + glu::getErrorStr(err).toString());
}